

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsecontext.cpp
# Opt level: O2

void __thiscall FParseContext::AddSym(FParseContext *this,char *sym,int val)

{
  FParseSymbol syme;
  
  syme.Value = val;
  strncpy(syme.Sym,sym,0x4f);
  syme.Sym[0x4f] = '\0';
  TArray<FParseSymbol,_FParseSymbol>::Push(&this->symbols,&syme);
  return;
}

Assistant:

void FParseContext::AddSym (char *sym, int val)
{
	FParseSymbol syme;
	syme.Value = val;
	strncpy (syme.Sym, sym, 79);
	syme.Sym[79]=0;
	symbols.Push(syme);
}